

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O0

string * gmlc::networking::stripProtocol(string *networkAddress)

{
  size_type __n;
  size_type in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  size_type loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  string *this;
  
  this = in_RDI;
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                  (unaff_retaddr,(char *)in_RDI,in_RSI);
  if (__n == 0xffffffffffffffff) {
    std::__cxx11::string::string
              (in_stack_00000020,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)networkAddress);
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,in_RSI,__n)
    ;
  }
  return in_RDI;
}

Assistant:

std::string stripProtocol(const std::string& networkAddress)
{
    auto loc = networkAddress.find("://");
    if (loc != std::string::npos) {
        return networkAddress.substr(loc + 3);
    }
    return networkAddress;
}